

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_ObjectDefineProperties(JSContext *ctx,JSValue obj,JSValue properties)

{
  int iVar1;
  ulong uVar2;
  JSValue obj_00;
  JSValue v;
  int local_64;
  uint32_t len;
  JSPropertyEnum *atoms;
  
  if ((int)obj.tag == -1) {
    obj_00 = JS_ToObject(ctx,properties);
    if ((int)obj_00.tag != 6) {
      iVar1 = JS_GetOwnPropertyNamesInternal(ctx,&atoms,&len,(JSObject *)obj_00.u.ptr,0x13);
      local_64 = -1;
      if (iVar1 < 0) {
        v = (JSValue)(ZEXT816(3) << 0x40);
      }
      else {
        uVar2 = 0;
        v = (JSValue)(ZEXT816(3) << 0x40);
        do {
          if (len == uVar2) {
            local_64 = 0;
            break;
          }
          JS_FreeValue(ctx,v);
          v = JS_GetPropertyInternal(ctx,obj_00,atoms[uVar2].atom,obj_00,0);
          if ((int)v.tag == 6) break;
          iVar1 = JS_DefinePropertyDesc(ctx,obj,atoms[uVar2].atom,v,0x4000);
          uVar2 = uVar2 + 1;
        } while (-1 < iVar1);
      }
      js_free_prop_enum(ctx,atoms,len);
      JS_FreeValue(ctx,obj_00);
      JS_FreeValue(ctx,v);
      return local_64;
    }
  }
  else {
    JS_ThrowTypeErrorNotAnObject(ctx);
  }
  return -1;
}

Assistant:

static __exception int JS_ObjectDefineProperties(JSContext *ctx,
                                                 JSValueConst obj,
                                                 JSValueConst properties)
{
    JSValue props, desc;
    JSObject *p;
    JSPropertyEnum *atoms;
    uint32_t len, i;
    int ret = -1;

    if (!JS_IsObject(obj)) {
        JS_ThrowTypeErrorNotAnObject(ctx);
        return -1;
    }
    desc = JS_UNDEFINED;
    props = JS_ToObject(ctx, properties);
    if (JS_IsException(props))
        return -1;
    p = JS_VALUE_GET_OBJ(props);
    if (JS_GetOwnPropertyNamesInternal(ctx, &atoms, &len, p, JS_GPN_ENUM_ONLY | JS_GPN_STRING_MASK | JS_GPN_SYMBOL_MASK) < 0)
        goto exception;
    for(i = 0; i < len; i++) {
        JS_FreeValue(ctx, desc);
        desc = JS_GetProperty(ctx, props, atoms[i].atom);
        if (JS_IsException(desc))
            goto exception;
        if (JS_DefinePropertyDesc(ctx, obj, atoms[i].atom, desc, JS_PROP_THROW) < 0)
            goto exception;
    }
    ret = 0;

exception:
    js_free_prop_enum(ctx, atoms, len);
    JS_FreeValue(ctx, props);
    JS_FreeValue(ctx, desc);
    return ret;
}